

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeBreitWignerBlock,double,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner>
::GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeBreitWignerBlock,double,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner>
           *this,double awri,double spi,double ap,optional<double> *dap,uint nls,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT,int NSRS,int NLRS)

{
  int in_stack_ffffffffffffff98;
  vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock>_>
  local_48;
  
  readSequence<njoy::ENDFtk::section::Type<32,151>::ShortRangeBreitWignerBlock,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_48,(ENDFtk *)it,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,MF,MT,NSRS,in_stack_ffffffffffffff98);
  GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,awri,spi,ap,dap,nls,&local_48,it,end,lineNumber,MAT,MF,MT,NLRS);
  std::
  vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock>_>
  ::~vector(&local_48);
  return;
}

Assistant:

GeneralCovarianceBase( double awri, double spi, double ap,
                       std::optional< RadiusUncertainty >&& dap,
                       unsigned int nls,
                       Iterator& it, const Iterator& end, long& lineNumber,
                       int MAT, int MF, int MT, int NSRS, int NLRS ) :
  // no try ... catch: exceptions will be handled in the derived class
  GeneralCovarianceBase( awri, spi, ap, std::move( dap ), nls,
                         njoy::ENDFtk::readSequence< ShortRangeCovarianceBlock >(
                             it, end, lineNumber, MAT, MF, MT, NSRS ),
                         it, end, lineNumber, MAT, MF, MT, NLRS ) {}